

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_typed_array_find(JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int findIndex)

{
  JSValue v;
  JSValue v_00;
  JSValue v_01;
  JSValue val_00;
  JSValue this_obj;
  JSValue prop;
  JSValue func_obj;
  JSValue this_obj_00;
  JSValue JVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int in_R9D;
  JSValue JVar5;
  JSValue JVar6;
  int k;
  int len;
  JSValue res;
  JSValue index_val;
  JSValue val;
  JSValue args [3];
  JSValue this_arg;
  JSValue func;
  JSValueUnion in_stack_fffffffffffffea0;
  JSValueUnion in_stack_fffffffffffffea8;
  JSValueUnion in_stack_fffffffffffffeb0;
  int64_t in_stack_fffffffffffffeb8;
  JSContext *ctx_00;
  undefined4 uVar7;
  undefined4 in_stack_fffffffffffffed4;
  int64_t iVar8;
  undefined4 uVar9;
  undefined4 in_stack_fffffffffffffee4;
  undefined8 uVar10;
  JSValueUnion in_stack_fffffffffffffef8;
  JSValueUnion in_stack_ffffffffffffff00;
  JSValue *argv_00;
  int local_50;
  undefined4 uStack_4c;
  JSValue *local_48;
  undefined4 uStack_2c;
  undefined4 uStack_c;
  
  uVar9 = 0;
  uVar10 = 3;
  JVar5.tag = in_stack_fffffffffffffeb8;
  JVar5.u.ptr = in_stack_fffffffffffffeb0.ptr;
  iVar2 = js_typed_array_get_length_internal((JSContext *)in_stack_fffffffffffffea8.ptr,JVar5);
  if ((iVar2 < 0) ||
     (JVar6.tag = in_stack_fffffffffffffeb8, JVar6.u.ptr = in_stack_fffffffffffffeb0.ptr,
     iVar3 = check_function((JSContext *)in_stack_fffffffffffffea8.ptr,JVar6), iVar3 != 0)) {
LAB_001c225a:
    v_01.tag = (int64_t)in_stack_fffffffffffffeb0.ptr;
    v_01.u.float64 = in_stack_fffffffffffffea8.float64;
    JS_FreeValue((JSContext *)in_stack_fffffffffffffea0.ptr,v_01);
    local_50 = 0;
    local_48 = (JSValue *)0x6;
  }
  else {
    uVar7 = 0;
    iVar8 = 3;
    local_50 = 0;
    while (local_50 < iVar2) {
      ctx_00 = (JSContext *)0x0;
      argv_00 = (JSValue *)0x0;
      this_obj_00.tag = (int64_t)in_stack_ffffffffffffff00.ptr;
      this_obj_00.u.float64 = in_stack_fffffffffffffef8.float64;
      prop.tag._0_4_ = local_50;
      prop.u.ptr = (void *)uVar10;
      prop.tag._4_4_ = iVar2;
      iVar3 = local_50;
      JVar5 = JS_GetPropertyValue((JSContext *)CONCAT44(in_stack_fffffffffffffee4,uVar9),this_obj_00
                                  ,prop);
      in_stack_fffffffffffffeb0 = JVar5.u;
      local_48 = (JSValue *)JVar5.tag;
      iVar4 = JS_IsException(JVar5);
      if (iVar4 != 0) goto LAB_001c225a;
      func_obj.tag._0_4_ = iVar3;
      func_obj.u.ptr = (void *)uVar10;
      func_obj.tag._4_4_ = iVar2;
      this_obj.tag._0_4_ = uVar9;
      this_obj.u.ptr = (void *)iVar8;
      this_obj.tag._4_4_ = in_stack_fffffffffffffee4;
      JVar6 = JS_Call((JSContext *)CONCAT44(in_stack_fffffffffffffed4,uVar7),func_obj,this_obj,
                      (int)((ulong)ctx_00 >> 0x20),argv_00);
      in_stack_fffffffffffffea0 = JVar6.u;
      in_stack_fffffffffffffea8 = (JSValueUnion)JVar6.tag;
      in_stack_fffffffffffffef8 = in_stack_fffffffffffffea0;
      in_stack_ffffffffffffff00 = in_stack_fffffffffffffea8;
      iVar4 = JS_IsException(JVar6);
      if (iVar4 != 0) goto LAB_001c225a;
      val_00.u._4_4_ = in_stack_fffffffffffffed4;
      val_00.u.int32 = uVar7;
      val_00.tag = iVar8;
      iVar4 = JS_ToBoolFree(ctx_00,val_00);
      if (iVar4 != 0) {
        if (in_R9D == 0) {
          local_50 = JVar5.u._0_4_;
          uStack_4c = JVar5.u._4_4_;
        }
        else {
          v.tag = (int64_t)in_stack_fffffffffffffeb0.ptr;
          v.u.ptr = in_stack_fffffffffffffea8.ptr;
          JS_FreeValue((JSContext *)in_stack_fffffffffffffea0.ptr,v);
          uStack_4c = uStack_c;
          local_48 = argv_00;
        }
        goto LAB_001c228e;
      }
      v_00.tag = (int64_t)in_stack_fffffffffffffeb0.ptr;
      v_00.u.ptr = in_stack_fffffffffffffea8.ptr;
      JS_FreeValue((JSContext *)in_stack_fffffffffffffea0.ptr,v_00);
      local_50 = iVar3 + 1;
    }
    if (in_R9D == 0) {
      local_50 = 0;
      local_48 = (JSValue *)0x3;
    }
    else {
      local_50 = -1;
      uStack_4c = uStack_2c;
      local_48 = (JSValue *)0x0;
    }
  }
LAB_001c228e:
  JVar1.u._4_4_ = uStack_4c;
  JVar1.u.int32 = local_50;
  JVar1.tag = (int64_t)local_48;
  return JVar1;
}

Assistant:

static JSValue js_typed_array_find(JSContext *ctx, JSValueConst this_val,
                                   int argc, JSValueConst *argv, int findIndex)
{
    JSValueConst func, this_arg;
    JSValueConst args[3];
    JSValue val, index_val, res;
    int len, k;

    val = JS_UNDEFINED;
    len = js_typed_array_get_length_internal(ctx, this_val);
    if (len < 0)
        goto exception;

    func = argv[0];
    if (check_function(ctx, func))
        goto exception;

    this_arg = JS_UNDEFINED;
    if (argc > 1)
        this_arg = argv[1];

    for(k = 0; k < len; k++) {
        index_val = JS_NewInt32(ctx, k);
        val = JS_GetPropertyValue(ctx, this_val, index_val);
        if (JS_IsException(val))
            goto exception;
        args[0] = val;
        args[1] = index_val;
        args[2] = this_val;
        res = JS_Call(ctx, func, this_arg, 3, args);
        if (JS_IsException(res))
            goto exception;
        if (JS_ToBoolFree(ctx, res)) {
            if (findIndex) {
                JS_FreeValue(ctx, val);
                return index_val;
            } else {
                return val;
            }
        }
        JS_FreeValue(ctx, val);
    }
    if (findIndex)
        return JS_NewInt32(ctx, -1);
    else
        return JS_UNDEFINED;

exception:
    JS_FreeValue(ctx, val);
    return JS_EXCEPTION;
}